

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int gmatch(lua_State *L)

{
  StkId pTVar1;
  StkId pTVar2;
  StkId pTVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  ulong uVar8;
  StkId pTVar9;
  ulong uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  luaL_checklstring(L,1,(size_t *)0x0);
  luaL_checklstring(L,2,(size_t *)0x0);
  auVar6 = _DAT_00115030;
  auVar5 = _DAT_00115020;
  auVar4 = _DAT_00115010;
  pTVar2 = L->top;
  pTVar3 = L->base;
  pTVar1 = pTVar3 + 2;
  if (pTVar2 < pTVar1) {
    pTVar9 = pTVar2 + 1;
    if (pTVar2 + 1 < pTVar1) {
      pTVar9 = pTVar1;
    }
    uVar8 = (long)&pTVar9->value + ~(ulong)pTVar2;
    auVar14._8_4_ = (int)uVar8;
    auVar14._0_8_ = uVar8;
    auVar14._12_4_ = (int)(uVar8 >> 0x20);
    auVar11._0_8_ = uVar8 >> 4;
    auVar11._8_8_ = auVar14._8_8_ >> 4;
    piVar7 = &pTVar2[3].tt;
    uVar10 = 0;
    auVar11 = auVar11 ^ _DAT_00115030;
    do {
      auVar13._8_4_ = (int)uVar10;
      auVar13._0_8_ = uVar10;
      auVar13._12_4_ = (int)(uVar10 >> 0x20);
      auVar14 = (auVar13 | auVar5) ^ auVar6;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                  iVar12 < auVar14._4_4_) & 1)) {
        piVar7[-0xc] = 0;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        piVar7[-8] = 0;
      }
      auVar14 = (auVar13 | auVar4) ^ auVar6;
      iVar15 = auVar14._4_4_;
      if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar14._0_4_ <= auVar11._0_4_)) {
        piVar7[-4] = 0;
        *piVar7 = 0;
      }
      uVar10 = uVar10 + 4;
      piVar7 = piVar7 + 0x10;
    } while (((uVar8 >> 4) + 4 & 0xfffffffffffffffc) != uVar10);
  }
  L->top = pTVar1;
  pTVar3[2].value.gc = (GCObject *)0x0;
  pTVar3[2].tt = 3;
  L->top = L->top + 1;
  lua_pushcclosure(L,gmatch_aux,3);
  return 1;
}

Assistant:

static int gmatch(lua_State*L){
luaL_checkstring(L,1);
luaL_checkstring(L,2);
lua_settop(L,2);
lua_pushinteger(L,0);
lua_pushcclosure(L,gmatch_aux,3);
return 1;
}